

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O1

void __thiscall MobileElementManager::UpdatePropensity(MobileElementManager *this,int index)

{
  _Rb_tree_color _Var1;
  pointer pdVar2;
  _Base_ptr p_Var3;
  int iVar4;
  int iVar5;
  SpeciesTracker *pSVar6;
  const_iterator cVar7;
  const_iterator cVar8;
  runtime_error *this_00;
  _Base_ptr p_Var9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  shared_ptr<MobileElement> pol;
  string codon;
  double local_a8;
  key_type local_80;
  undefined1 local_60 [16];
  undefined1 local_50 [32];
  
  GetPol((MobileElementManager *)local_60,(int)this);
  iVar5 = *(int *)(local_60._0_8_ + 0x3c);
  pSVar6 = SpeciesTracker::Instance();
  iVar4 = std::__cxx11::string::compare((char *)(local_60._0_8_ + 0x18));
  if ((iVar4 == 0) && ((pSVar6->codon_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0))
  {
    if ((iVar5 < 0) || ((this->seq_)._M_string_length <= (ulong)(long)iVar5)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Genome sequence not correct size.");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::substr((ulong)local_50,(ulong)&this->seq_);
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::find(&(pSVar6->codon_map_)._M_t,(key_type *)local_50);
    p_Var9 = *(_Base_ptr *)(cVar7._M_node + 2);
    p_Var3 = cVar7._M_node[2]._M_parent;
    if (p_Var9 == p_Var3) {
      local_a8 = 0.0;
    }
    else {
      local_a8 = 0.0;
      do {
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,*(long *)p_Var9,
                   (long)&p_Var9->_M_parent->_M_color + *(long *)p_Var9);
        std::__cxx11::string::append((char *)&local_80);
        cVar8 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::find(&(pSVar6->species_)._M_t,&local_80);
        _Var1 = cVar8._M_node[2]._M_color;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
        local_a8 = local_a8 + (double)(int)_Var1;
        p_Var9 = p_Var9 + 1;
      } while (p_Var9 != p_Var3);
    }
    if ((undefined1 *)local_50._0_8_ != local_50 + 0x10) {
      operator_delete((void *)local_50._0_8_);
    }
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)(local_60._0_8_ + 0x18));
    local_a8 = 1.0;
    if ((iVar5 == 0) &&
       (pdVar2 = (this->weights_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
       pdVar2 != (this->weights_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish)) {
      local_a8 = pdVar2[(long)*(int *)(local_60._0_8_ + 0x3c) + -1] + 0.0;
    }
  }
  local_a8 = local_a8 * *(double *)(local_60._0_8_ + 0x48);
  pdVar2 = (this->prop_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  this->prop_sum_ = (local_a8 - pdVar2[index]) + this->prop_sum_;
  pdVar2[index] = local_a8;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
  }
  return;
}

Assistant:

void MobileElementManager::UpdatePropensity(int index) {
  auto pol = GetPol(index);
  int position_index = pol->stop();
  auto &tracker = SpeciesTracker::Instance();
  double weight = 1; 
  if (pol->name() == "__ribosome" && !tracker.codon_map().empty()) {
    if (position_index >= seq_.size() || position_index < 0) {
      throw std::runtime_error("Genome sequence not correct size.");
    }
    weight--;
    std::string codon = seq_.substr(pol->stop(), 3);
    //std::cout << codon << std::endl;
    // std::vector<std::string> stop_codons = {"TAG", "TAA", "TGA"};
    // check if occupied codon is a stop codon
    // if (std::find(stop_codons.begin(), stop_codons.end(), codon) == stop_codons.end()) {
    auto anticodons = tracker.codon_map().find(codon);
    for (auto const& anticodon : anticodons->second) {
      // std::cout << anticodon << std::endl;
      weight += tracker.species().find(anticodon + "_charged")->second;
    }
  } else if (pol->name() == "__ribosome" && !weights_.empty()) {
      weight--;
      weight += weights_[pol->stop() - 1];
  }
  double new_speed = weight * pol->speed();
  double diff = new_speed - prop_list_[index];
  prop_sum_ += diff;
  prop_list_[index] = new_speed;
}